

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O2

QString * __thiscall
QLocaleData::DataRange::getListEntry
          (QString *__return_storage_ptr__,DataRange *this,char16_t *table,qsizetype index)

{
  long in_FS_OFFSET;
  DataRange local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = listEntry(this,table,index);
  getData(__return_storage_ptr__,&local_20,table);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] QString getListEntry(const char16_t *table, qsizetype index) const
        {
            return listEntry(table, index).getData(table);
        }